

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.h
# Opt level: O0

bool __thiscall
ParsePackage::_SafeSprintf<int&>
          (ParsePackage *this,bool is_str,char *buf,char *end,char *format,int *args)

{
  size_t sVar1;
  char local_1098 [4];
  int len_1;
  char temp_buf_1 [64];
  char local_1048 [4];
  int len;
  char temp_buf [4096];
  int *args_local;
  char *format_local;
  char *end_local;
  char *buf_local;
  bool is_str_local;
  ParsePackage *this_local;
  
  if (is_str) {
    memset(local_1048,0,0x1000);
    sprintf(local_1048,format,(ulong)(uint)*args);
    sVar1 = strlen(local_1048);
    if (end < buf + (int)sVar1) {
      this_local._7_1_ = false;
    }
    else {
      sprintf(buf,"%s",local_1048);
      this_local._7_1_ = true;
    }
  }
  else {
    memset(local_1098,0,0x40);
    sprintf(local_1098,format,(ulong)(uint)*args);
    sVar1 = strlen(local_1098);
    if (end < buf + (int)sVar1) {
      this_local._7_1_ = false;
    }
    else {
      sprintf(buf,"%s",local_1098);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ParsePackage::_SafeSprintf(bool is_str, char* buf, char* end, const char* format, Args&&... args) {
    if (is_str) {
        char temp_buf[4096] = { 0 };
        sprintf(temp_buf, format, std::forward<Args>(args)...);
        int len = strlen(temp_buf);
        if (len + buf > end) {
            return false;
        }
        sprintf(buf, "%s", temp_buf);
        return true;

    } else {
        char temp_buf[64] = { 0 };
        sprintf(temp_buf, format, std::forward<Args>(args)...);
        int len = strlen(temp_buf);
        if (len + buf > end) {
            return false;
        }
        sprintf(buf, "%s", temp_buf);
        return true;
    }
}